

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

bool P_AlignFlat(int linenum,int side,int fc)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  line_t *plVar5;
  DAngle angle;
  TVector2<double> local_40;
  double dStack_30;
  
  plVar5 = lines + linenum;
  dVar2 = plVar5->bbox[(ulong)(side != 0) + 4];
  if (dVar2 != 0.0) {
    local_40.Y = (plVar5->delta).X;
    dStack_30 = (plVar5->delta).Y;
    TVector2<double>::Angle(&local_40);
    dVar3 = local_40.X + -90.0;
    dVar4 = fastcosdeg(dVar3);
    dVar1 = (plVar5->v1->p).X;
    dVar3 = fastsindeg(dVar3);
    dVar1 = dVar3 * (plVar5->v1->p).Y + dVar4 * dVar1;
    if (side == 0) {
      dVar1 = -dVar1;
    }
    else {
      local_40.X = local_40.X + 180.0;
    }
    *(double *)((long)dVar2 + 0x10 + (long)fc * 0x58) = dVar1;
    *(double *)((long)dVar2 + 0x30 + (long)fc * 0x58) = -local_40.X;
  }
  return dVar2 != 0.0;
}

Assistant:

bool P_AlignFlat (int linenum, int side, int fc)
{
	line_t *line = lines + linenum;
	sector_t *sec = side ? line->backsector : line->frontsector;

	if (!sec)
		return false;

	DAngle angle = line->Delta().Angle();
	DAngle norm = angle - 90;
	double dist = -(norm.Cos() * line->v1->fX() + norm.Sin() * line->v1->fY());

	if (side)
	{
		angle += 180.;
		dist = -dist;
	}

	sec->SetBase(fc, dist, -angle);
	return true;
}